

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedNodeMap.c
# Opt level: O2

IXML_Node_conflict * ixmlNamedNodeMap_item(IXML_NamedNodeMap *nnMap,unsigned_long index)

{
  IXML_Node_conflict *pIVar1;
  unsigned_long uVar2;
  ulong uVar3;
  
  if (nnMap != (IXML_NamedNodeMap *)0x0) {
    uVar2 = ixmlNamedNodeMap_getLength(nnMap);
    uVar3 = 0;
    if (index <= uVar2 - 1) {
      while( true ) {
        pIVar1 = nnMap->nodeItem;
        if (index <= uVar3) {
          return pIVar1;
        }
        if (pIVar1 == (IXML_Node_conflict *)0x0) break;
        nnMap = (IXML_NamedNodeMap *)&pIVar1->nextSibling;
        uVar3 = (ulong)((int)uVar3 + 1);
      }
      return (IXML_Node_conflict *)0x0;
    }
  }
  return (IXML_Node_conflict *)0x0;
}

Assistant:

IXML_Node *ixmlNamedNodeMap_item(
	/* IN */ IXML_NamedNodeMap *nnMap,
	/* IN */ unsigned long index)
{
	IXML_Node *tempNode;
	unsigned int i;

	if (nnMap == NULL) {
		return NULL;
	}

	if (index > ixmlNamedNodeMap_getLength(nnMap) - 1lu) {
		return NULL;
	}

	tempNode = nnMap->nodeItem;
	for (i = 0u; i < index && tempNode != NULL; ++i) {
		tempNode = tempNode->nextSibling;
	}

	return tempNode;
}